

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::checkInvalidations
          (SimplifyLocals<true,_true,_true> *this,EffectAnalyzer *effects)

{
  pointer puVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  undefined1 auVar4 [8];
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> invalidated;
  uint local_34 [2];
  uint index;
  
  invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  for (p_Var3 = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      puVar1 = invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
      (_Rb_tree_header *)p_Var3 != &(this->sinkables)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar2 = EffectAnalyzer::invalidates(effects,(EffectAnalyzer *)&p_Var3[1]._M_left);
    if (bVar2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
                 &p_Var3[1]._M_color);
    }
  }
  for (auVar4 = auStack_58; auVar4 != (undefined1  [8])puVar1;
      auVar4 = (undefined1  [8])((long)auVar4 + 4)) {
    local_34[0] = *(uint *)auVar4;
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
    ::erase(&(this->sinkables)._M_t,local_34);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58);
  return;
}

Assistant:

void checkInvalidations(EffectAnalyzer& effects) {
    // TODO: this is O(bad)
    std::vector<Index> invalidated;
    for (auto& [index, info] : sinkables) {
      if (effects.invalidates(info.effects)) {
        invalidated.push_back(index);
      }
    }
    for (auto index : invalidated) {
      sinkables.erase(index);
    }
  }